

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O1

void __thiscall Fl_Paged_Device::traverse(Fl_Paged_Device *this,Fl_Widget *widget)

{
  Fl_Widget *widget_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_Widget **ppFVar3;
  undefined4 extraout_var_00;
  long lVar4;
  Fl_Group *this_00;
  
  iVar1 = (*widget->_vptr_Fl_Widget[7])(widget);
  this_00 = (Fl_Group *)CONCAT44(extraout_var,iVar1);
  if ((this_00 != (Fl_Group *)0x0) && (iVar1 = this_00->children_, 0 < (long)iVar1)) {
    lVar4 = 0;
    do {
      ppFVar3 = Fl_Group::array(this_00);
      widget_00 = ppFVar3[lVar4];
      if ((widget_00->flags_ & 2) == 0) {
        iVar2 = (*widget_00->_vptr_Fl_Widget[8])(widget_00);
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          traverse(this,widget_00);
        }
        else {
          (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xe])
                    (this,widget_00,(ulong)(uint)widget_00->x_,(ulong)(uint)widget_00->y_);
        }
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void Fl_Paged_Device::traverse(Fl_Widget *widget)
{
  Fl_Group *g = widget->as_group();
  if (!g) return;
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() ) continue;
    if ( c->as_window() ) {
      print_widget(c, c->x(), c->y());
    }
    else traverse(c);
  }
}